

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O0

void modify_function<std::function<cs_impl::any(std::vector<cs_impl::any,std::allocator<cs_impl::any>>&)>const&,cs::callable::types>
               (var *func,
               function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
               *args,types *args_1)

{
  int level_00;
  var *in_RDI;
  undefined1 unaff_retaddr;
  any *in_stack_00000008;
  any *in_stack_00000010;
  int level;
  types *in_stack_ffffffffffffffd0;
  function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
  *in_stack_ffffffffffffffd8;
  
  level_00 = remove_protect(in_RDI);
  cs_impl::any::
  make<cs::callable,std::function<cs_impl::any(std::vector<cs_impl::any,std::allocator<cs_impl::any>>&)>const&,cs::callable::types>
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  cs_impl::any::swap(in_stack_00000010,in_stack_00000008,(bool)unaff_retaddr);
  cs_impl::any::~any((any *)0x427f72);
  set_protect(in_RDI,level_00);
  return;
}

Assistant:

void modify_function(cs::var &func, ArgsT &&...args) {
    int level = remove_protect(func);
    func.swap(cs::var::make<cs::callable>(std::forward<ArgsT>(args)...), true);
    set_protect(func, level);
}